

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

zip_int64_t buffer_read(buffer_t *buffer,zip_uint8_t *data,zip_uint64_t length,zip_error_t *error)

{
  size_t local_60;
  ulong local_58;
  zip_uint64_t left;
  zip_uint64_t fragment_offset;
  zip_uint64_t i;
  zip_uint64_t n;
  zip_error_t *error_local;
  zip_uint64_t length_local;
  zip_uint8_t *data_local;
  buffer_t *buffer_local;
  
  local_58 = length;
  if (buffer->size - buffer->offset <= length) {
    local_58 = buffer->size - buffer->offset;
  }
  if (local_58 == 0) {
    buffer_local = (buffer_t *)0x0;
  }
  else if (local_58 < 0x8000000000000000) {
    fragment_offset = buffer->offset / buffer->fragment_size;
    left = buffer->offset % buffer->fragment_size;
    for (i = 0; i < local_58; i = local_60 + i) {
      if (local_58 - i < buffer->fragment_size - left) {
        local_60 = local_58 - i;
      }
      else {
        local_60 = buffer->fragment_size - left;
      }
      if (buffer->fragment[fragment_offset] == (zip_uint8_t *)0x0) {
        memset(data + i,0,local_60);
      }
      else {
        memcpy(data + i,buffer->fragment[fragment_offset] + left,local_60);
      }
      fragment_offset = fragment_offset + 1;
      left = 0;
    }
    buffer->offset = i + buffer->offset;
    buffer_local = (buffer_t *)i;
  }
  else {
    buffer_local = (buffer_t *)0xffffffffffffffff;
  }
  return (zip_int64_t)buffer_local;
}

Assistant:

static zip_int64_t
buffer_read(buffer_t *buffer, zip_uint8_t *data, zip_uint64_t length, zip_error_t *error) {
    zip_uint64_t n, i, fragment_offset;

    length = MY_MIN(length, buffer->size - buffer->offset);

    if (length == 0) {
	return 0;
    }
    if (length > ZIP_INT64_MAX) {
	return -1;
    }

    i = buffer->offset / buffer->fragment_size;
    fragment_offset = buffer->offset % buffer->fragment_size;
    n = 0;
    while (n < length) {
	zip_uint64_t left = MY_MIN(length - n, buffer->fragment_size - fragment_offset);

	if (buffer->fragment[i]) {
	    memcpy(data + n, buffer->fragment[i] + fragment_offset, left);
	}
	else {
	    memset(data + n, 0, left);
	}

	n += left;
	i++;
	fragment_offset = 0;
    }

    buffer->offset += n;
    return (zip_int64_t)n;
}